

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O0

void test_mu_producer_consumer5(testing t)

{
  mu_queue *a1;
  closure *cl;
  mu_queue *q;
  testing t_local;
  
  a1 = mu_queue_new(100000);
  cl = closure_producer_mu_n(producer_mu_n,t,a1,0,100000);
  closure_fork(cl);
  consumer_mu_n(t,a1,0,100000);
  free(a1);
  return;
}

Assistant:

static void test_mu_producer_consumer5 (testing t) {
	mu_queue *q = mu_queue_new (100000);
	closure_fork (closure_producer_mu_n (&producer_mu_n, t, q, 0, MU_PRODUCER_CONSUMER_N));
	consumer_mu_n (t, q, 0, MU_PRODUCER_CONSUMER_N);
	free (q);
}